

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorBuilder::~DescriptorBuilder(DescriptorBuilder *this)

{
  std::__cxx11::string::~string((string *)&this->undefine_resolved_name_);
  std::__cxx11::string::~string((string *)&this->possible_undeclared_dependency_name_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~raw_hash_set(&(this->unused_dependency_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                   *)&this->message_hints_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~raw_hash_set(&(this->dependencies_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  std::__cxx11::string::~string((string *)&this->filename_);
  std::
  vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::~vector(&this->options_to_interpret_);
  std::_Optional_payload_base<google::protobuf::FeatureResolver>::_M_reset
            ((_Optional_payload_base<google::protobuf::FeatureResolver> *)&this->feature_resolver_);
  return;
}

Assistant:

DescriptorBuilder::~DescriptorBuilder() = default;